

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O0

bool __thiscall mkvparser::Segment::AppendCluster(Segment *this,Cluster *pCluster)

{
  long lVar1;
  undefined8 *puVar2;
  undefined1 auVar3 [16];
  ulong *puVar4;
  ulong uVar5;
  undefined8 *puVar6;
  long *plVar7;
  long *plVar8;
  long lVar9;
  long in_RSI;
  long in_RDI;
  Cluster **qq_1;
  Cluster **q_1;
  Cluster **p_1;
  Cluster **pp;
  Cluster **p;
  Cluster **q;
  Cluster **qq;
  long n;
  long idx;
  long *size;
  long count;
  ulong local_80;
  long *local_68;
  undefined8 *local_50;
  undefined8 *local_48;
  bool local_1;
  
  if ((in_RSI == 0) || (*(long *)(in_RSI + 0x10) < 0)) {
    local_1 = false;
  }
  else {
    lVar9 = *(long *)(in_RDI + 0xb0) + *(long *)(in_RDI + 0xb8);
    puVar4 = (ulong *)(in_RDI + 0xc0);
    lVar1 = *(long *)(in_RSI + 0x10);
    if (((long)*puVar4 < lVar9) || (lVar1 != *(long *)(in_RDI + 0xb0))) {
      local_1 = false;
    }
    else {
      if ((long)*puVar4 <= lVar9) {
        if ((long)*puVar4 < 1) {
          local_80 = 0x800;
        }
        else {
          local_80 = *puVar4 << 1;
        }
        auVar3._8_8_ = 0;
        auVar3._0_8_ = local_80;
        uVar5 = SUB168(auVar3 * ZEXT816(8),0);
        if (SUB168(auVar3 * ZEXT816(8),8) != 0) {
          uVar5 = 0xffffffffffffffff;
        }
        puVar6 = (undefined8 *)operator_new__(uVar5,(nothrow_t *)&std::nothrow);
        if (puVar6 == (undefined8 *)0x0) {
          return false;
        }
        puVar2 = *(undefined8 **)(in_RDI + 0xa8);
        local_50 = puVar2;
        local_48 = puVar6;
        while (local_50 != puVar2 + lVar9) {
          *local_48 = *local_50;
          local_50 = local_50 + 1;
          local_48 = local_48 + 1;
        }
        if (*(void **)(in_RDI + 0xa8) != (void *)0x0) {
          operator_delete__(*(void **)(in_RDI + 0xa8));
        }
        *(undefined8 **)(in_RDI + 0xa8) = puVar6;
        *puVar4 = local_80;
      }
      if (0 < *(long *)(in_RDI + 0xb8)) {
        plVar7 = (long *)(*(long *)(in_RDI + 0xa8) + *(long *)(in_RDI + 0xb0) * 8);
        if ((*plVar7 == 0) || (-1 < *(long *)(*plVar7 + 0x10))) {
          return false;
        }
        local_68 = plVar7 + *(long *)(in_RDI + 0xb8);
        if ((long *)(*(long *)(in_RDI + 0xa8) + *puVar4 * 8) <= plVar7 + *(long *)(in_RDI + 0xb8)) {
          return false;
        }
        do {
          plVar8 = local_68 + -1;
          if (-1 < *(long *)(*plVar8 + 0x10)) {
            return false;
          }
          *local_68 = *plVar8;
          local_68 = plVar8;
        } while (plVar8 != plVar7);
      }
      *(long *)(*(long *)(in_RDI + 0xa8) + lVar1 * 8) = in_RSI;
      *(long *)(in_RDI + 0xb0) = *(long *)(in_RDI + 0xb0) + 1;
      local_1 = true;
    }
  }
  return local_1;
}

Assistant:

bool Segment::AppendCluster(Cluster* pCluster) {
  if (pCluster == NULL || pCluster->m_index < 0)
    return false;

  const long count = m_clusterCount + m_clusterPreloadCount;

  long& size = m_clusterSize;
  const long idx = pCluster->m_index;

  if (size < count || idx != m_clusterCount)
    return false;

  if (count >= size) {
    const long n = (size <= 0) ? 2048 : 2 * size;

    Cluster** const qq = new (std::nothrow) Cluster*[n];
    if (qq == NULL)
      return false;

    Cluster** q = qq;
    Cluster** p = m_clusters;
    Cluster** const pp = p + count;

    while (p != pp)
      *q++ = *p++;

    delete[] m_clusters;

    m_clusters = qq;
    size = n;
  }

  if (m_clusterPreloadCount > 0) {
    Cluster** const p = m_clusters + m_clusterCount;
    if (*p == NULL || (*p)->m_index >= 0)
      return false;

    Cluster** q = p + m_clusterPreloadCount;
    if (q >= (m_clusters + size))
      return false;

    for (;;) {
      Cluster** const qq = q - 1;
      if ((*qq)->m_index >= 0)
        return false;

      *q = *qq;
      q = qq;

      if (q == p)
        break;
    }
  }

  m_clusters[idx] = pCluster;
  ++m_clusterCount;
  return true;
}